

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O3

bool __thiscall draco::ObjDecoder::ParseMaterialFileDefinition(ObjDecoder *this,Status *param_1)

{
  DecoderBuffer *buffer;
  long lVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  string str;
  string local_40;
  
  buffer = &this->buffer_;
  parser::SkipWhitespace(buffer);
  lVar1 = (this->buffer_).pos_;
  if ((this->buffer_).data_size_ < lVar1 + 1) {
    return false;
  }
  if (buffer->data_[lVar1] == '#') {
    parser::SkipLine(buffer);
    return true;
  }
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar2 = parser::ParseString(buffer,&local_40);
  if (bVar2) {
    iVar3 = std::__cxx11::string::compare((char *)&local_40);
    bVar2 = true;
    if (iVar3 != 0) goto LAB_0010f2fd;
    parser::SkipWhitespace(buffer);
    parser::ParseLine(buffer,&local_40);
    if (local_40._M_string_length != 0) {
      iVar3 = this->num_materials_;
      this->num_materials_ = iVar3 + 1;
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->material_name_to_id_,&local_40);
      *pmVar4 = iVar3;
      goto LAB_0010f2fd;
    }
  }
  bVar2 = false;
LAB_0010f2fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool ObjDecoder::ParseMaterialFileDefinition(Status * /* status */) {
  char c;
  parser::SkipWhitespace(buffer());
  if (!buffer()->Peek(&c)) {
    // End of file reached?.
    return false;
  }
  if (c == '#') {
    // Comment, ignore the line.
    parser::SkipLine(buffer());
    return true;
  }
  std::string str;
  if (!parser::ParseString(buffer(), &str)) {
    return false;
  }
  if (str == "newmtl") {
    parser::SkipWhitespace(buffer());
    parser::ParseLine(buffer(), &str);
    if (str.empty()) {
      return false;
    }
    // Add new material to our map.
    material_name_to_id_[str] = num_materials_++;
  }
  return true;
}